

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFMovecr<(moira::Instr)237,(moira::Mode)7,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((op & 0x3f) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)237,(moira::Mode)7,0>(this,str,addr,op);
    return;
  }
  pSVar3 = StrWriter::operator<<(str);
  StrWriter::operator<<(pSVar3,(Ffmt)0x2);
  StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
  pSVar3 = StrWriter::operator<<(pSVar3,(Imu<4>)(uVar2 & 0x7f));
  StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Fp)(uVar2 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFMovecr(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto dst = ______xxx_______ (ext);
    auto ofs = _________xxxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Ffmt{2} << str.tab << Imu{ofs} << Sep{} << Fp{dst};
}